

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

LogLevel __thiscall cmake::StringToLogLevel(cmake *this,string_view levelStr)

{
  const_iterator pvVar1;
  const_iterator __last;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_Message::LogLevel> *ppVar2;
  LogLevel local_ac;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_Message::LogLevel> *it;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string levelStrLowCase;
  LevelsPairArray *levels;
  string_view levelStr_local;
  
  levelStr_local._M_len = levelStr._M_len;
  levels = (LevelsPairArray *)this;
  levelStrLowCase.field_2._8_8_ = anon_unknown.dwarf_60c27b::getStringToLogLevelPairs();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_60,(basic_string_view<char,_std::char_traits<char>_> *)&levels,
             &local_61);
  cmsys::SystemTools::LowerCase((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  pvVar1 = std::
           array<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_Message::LogLevel>,_7UL>
           ::cbegin((array<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_Message::LogLevel>,_7UL>
                     *)levelStrLowCase.field_2._8_8_);
  __last = std::
           array<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_Message::LogLevel>,_7UL>
           ::cend((array<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_Message::LogLevel>,_7UL>
                   *)levelStrLowCase.field_2._8_8_);
  ppVar2 = std::
           find_if<std::pair<std::basic_string_view<char,std::char_traits<char>>,Message::LogLevel>const*,cmake::StringToLogLevel(std::basic_string_view<char,std::char_traits<char>>)::__0>
                     (pvVar1,__last,(string *)local_40);
  pvVar1 = std::
           array<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_Message::LogLevel>,_7UL>
           ::cend((array<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_Message::LogLevel>,_7UL>
                   *)levelStrLowCase.field_2._8_8_);
  if (ppVar2 == pvVar1) {
    local_ac = LOG_UNDEFINED;
  }
  else {
    local_ac = ppVar2->second;
  }
  std::__cxx11::string::~string((string *)local_40);
  return local_ac;
}

Assistant:

Message::LogLevel cmake::StringToLogLevel(cm::string_view levelStr)
{
  const LevelsPairArray& levels = getStringToLogLevelPairs();

  const auto levelStrLowCase =
    cmSystemTools::LowerCase(std::string{ levelStr });

  // NOLINTNEXTLINE(readability-qualified-auto)
  const auto it = std::find_if(levels.cbegin(), levels.cend(),
                               [&levelStrLowCase](const LevelsPair& p) {
                                 return p.first == levelStrLowCase;
                               });
  return (it != levels.cend()) ? it->second : Message::LogLevel::LOG_UNDEFINED;
}